

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_set_from_axisf3_angle_EXP(matrix4 *self,float x,float y,float z,float angle)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float s;
  float c;
  float angle_local;
  float z_local;
  float y_local;
  float x_local;
  matrix4 *self_local;
  
  dVar3 = cos((double)angle);
  fVar1 = (float)dVar3;
  dVar3 = sin((double)angle);
  fVar2 = (float)dVar3;
  (self->field_0).m[0] = x * x * (1.0 - fVar1) + fVar1;
  (self->field_0).m[4] = x * y * (1.0 - fVar1) + z * fVar2;
  (self->field_0).m[8] = x * z * (1.0 - fVar1) + -(y * fVar2);
  (self->field_0).m[0xc] = 0.0;
  (self->field_0).m[1] = y * x * (1.0 - fVar1) + -(z * fVar2);
  (self->field_0).m[5] = y * y * (1.0 - fVar1) + fVar1;
  (self->field_0).m[9] = y * z * (1.0 - fVar1) + x * fVar2;
  (self->field_0).m[0xd] = 0.0;
  (self->field_0).m[2] = z * x * (1.0 - fVar1) + y * fVar2;
  (self->field_0).m[6] = z * y * (1.0 - fVar1) + -(x * fVar2);
  (self->field_0).m[10] = z * z * (1.0 - fVar1) + fVar1;
  (self->field_0).m[0xe] = 0.0;
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[7] = 0.0;
  (self->field_0).m[0xb] = 0.0;
  (self->field_0).m[0xf] = 1.0;
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_set_from_axisf3_angle_EXP(struct matrix4 *self, HYP_FLOAT x, HYP_FLOAT y, HYP_FLOAT z, const HYP_FLOAT angle)
{
	HYP_FLOAT c = HYP_COS(angle);
	HYP_FLOAT s = HYP_SIN(angle);

	self->c00 = (x * x) * (1.0f - c) + c;
	self->c01 = (x * y) * (1.0f - c) + (z * s);
	self->c02 = (x * z) * (1.0f - c) - (y * s);
	self->c03 = 0.0f;

	self->c10 = (y * x) * (1.0f - c) - (z * s);
	self->c11 = (y * y) * (1.0f - c) + c;
	self->c12 = (y * z) * (1.0f - c) + (x * s);
	self->c13 = 0.0f;

	self->c20 = (z * x) * (1.0f - c) + (y * s);
	self->c21 = (z * y) * (1.0f - c) - (x * s);
	self->c22 = (z * z) * (1.0f - c) + c;
	self->c23 = 0.0f;

	self->c30 = 0.0f;
	self->c31 = 0.0f;
	self->c32 = 0.0f;
	self->c33 = 1.0f;

	return self;
}